

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoViableAltForCharException.cpp
# Opt level: O2

void __thiscall
antlr::NoViableAltForCharException::NoViableAltForCharException
          (NoViableAltForCharException *this,int c,CharScanner *scanner)

{
  int iVar1;
  int line_;
  int column_;
  undefined4 extraout_var;
  allocator<char> local_49;
  string local_48;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"NoViableAlt",&local_49);
  iVar1 = (*(scanner->super_TokenStream)._vptr_TokenStream[0x1a])(scanner);
  line_ = (*(scanner->super_TokenStream)._vptr_TokenStream[0x16])(scanner);
  column_ = (*(scanner->super_TokenStream)._vptr_TokenStream[0x18])(scanner);
  RecognitionException::RecognitionException
            (&this->super_RecognitionException,&local_48,(string *)CONCAT44(extraout_var,iVar1),
             line_,column_);
  std::__cxx11::string::~string((string *)&local_48);
  (this->super_RecognitionException).super_ANTLRException._vptr_ANTLRException =
       (_func_int **)&PTR__RecognitionException_0021aab0;
  this->foundChar = c;
  return;
}

Assistant:

NoViableAltForCharException::NoViableAltForCharException(int c, CharScanner* scanner)
  : RecognitionException("NoViableAlt",
                         scanner->getFilename(),
								 scanner->getLine(),scanner->getColumn()),
    foundChar(c)
{
}